

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_test.cpp
# Opt level: O3

void __thiscall
serial_test_DefaultConstructor_Test::TestBody(serial_test_DefaultConstructor_Test *this)

{
  size_t sVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  AssertHelperData *pAVar9;
  AssertHelperData *__s1;
  char *pcVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  size_t iterator;
  long lVar13;
  char *pcVar14;
  char **ppcVar15;
  ulong uVar16;
  size_t size;
  AssertHelper local_108;
  size_t serialize_size;
  undefined8 *local_f8;
  size_t local_f0;
  undefined8 *local_e8 [19];
  AssertHelper local_50;
  char *local_48;
  undefined8 local_40;
  undefined8 *local_38;
  
  serialize_size = serialize_size & 0xffffffff00000000;
  uVar5 = log_policy_format_text();
  uVar6 = log_policy_schedule_sync();
  uVar7 = log_policy_storage_sequential();
  uVar8 = log_policy_stream_stdio(_stdout);
  uVar3 = log_configure_impl("metacall",4,uVar5,uVar6,uVar7,uVar8);
  size = CONCAT44(size._4_4_,uVar3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0",
             "(int)log_configure_impl(\"metacall\", 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&serialize_size,(int *)&size);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&serialize_size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x43,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&size,(Message *)&serialize_size);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&size);
    if (serialize_size != 0) {
      (**(code **)(*(long *)serialize_size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = memory_allocator_std(malloc,realloc,free);
  serialize_size = 0;
  local_f0 = size;
  testing::internal::CmpHelperNE<memory_allocator_type*,memory_allocator_type*>
            ((internal *)local_e8,"(memory_allocator)__null","(memory_allocator)allocator",
             (memory_allocator_type **)&serialize_size,(memory_allocator_type **)&size);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&serialize_size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x48,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&size,(Message *)&serialize_size);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&size);
    if (serialize_size != 0) {
      (**(code **)(*(long *)serialize_size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  serialize_size = serialize_size & 0xffffffff00000000;
  uVar3 = serial_initialize();
  size = CONCAT44(size._4_4_,uVar3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0","(int)serial_initialize()",(int *)&serialize_size,
             (int *)&size);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&serialize_size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x4b,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&size,(Message *)&serialize_size);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&size);
    if (serialize_size != 0) {
      (**(code **)(*(long *)serialize_size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  serial_test::create_serial(&this->super_serial_test,"rapid_json","json");
  serial_test::create_serial(&this->super_serial_test,"metacall","meta");
  if (TestBody()::value_list == '\0') {
    iVar4 = __cxa_guard_acquire(&TestBody()::value_list);
    if (iVar4 != 0) {
      TestBody::value_list[0] = (value)value_create_int(0xf4);
      TestBody::value_list[1] = (value)value_create_double(0x33333333);
      TestBody::value_list[2] = (value)value_create_string("hello world",0xb);
      __cxa_guard_release(&TestBody()::value_list);
    }
  }
  if (TestBody()::value_map_a == '\0') {
    iVar4 = __cxa_guard_acquire(&TestBody()::value_map_a);
    if (iVar4 != 0) {
      TestBody::value_map_a[0] = (value)value_create_string("aaa",3);
      TestBody::value_map_a[1] = (value)value_create_double(0xe76c8b44);
      __cxa_guard_release(&TestBody()::value_map_a);
    }
  }
  if (TestBody()::value_map_b == '\0') {
    iVar4 = __cxa_guard_acquire(&TestBody()::value_map_b);
    if (iVar4 != 0) {
      TestBody::value_map_b[0] = (value)value_create_string("bbb",3);
      TestBody::value_map_b[1] = (value)value_create_double(0);
      __cxa_guard_release(&TestBody()::value_map_b);
    }
  }
  if (TestBody()::value_map == '\0') {
    iVar4 = __cxa_guard_acquire(&TestBody()::value_map);
    if (iVar4 != 0) {
      TestBody::value_map[0] = (value)value_create_array(TestBody::value_map_a,2);
      TestBody::value_map[1] = (value)value_create_array(TestBody::value_map_b,2);
      __cxa_guard_release(&TestBody()::value_map);
    }
  }
  serialize_size = 0;
  uVar5 = serial_create("rapid_json");
  pAVar9 = (AssertHelperData *)value_create_array(TestBody::value_list,3);
  size = 0;
  local_108.data_ = pAVar9;
  testing::internal::CmpHelperNE<void*,void*>
            ((internal *)local_e8,"(value)__null","(value)v",(void **)&size,&local_108.data_);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x88,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  __s1 = (AssertHelperData *)serial_serialize(uVar5,pAVar9,&serialize_size,local_f0);
  size = 0x18;
  local_108.data_ = (AssertHelperData *)serialize_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e8,"(size_t)sizeof(value_list_str)","(size_t)serialize_size",&size,
             (unsigned_long *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x8d,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = 0;
  local_108.data_ = __s1;
  testing::internal::CmpHelperNE<char*,char*>
            ((internal *)local_e8,"(char *)__null","(char *)buffer",(char **)&size,
             (char **)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x8e,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = size & 0xffffffff00000000;
  iVar4 = strcmp((char *)__s1,"[244,6.8,\"hello world\"]");
  local_108.data_._0_4_ = iVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0","(int)strcmp(buffer, value_list_str)",(int *)&size,
             (int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x8f,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  value_destroy(pAVar9);
  lVar13 = 0;
  do {
    value_destroy(*(undefined8 *)((long)TestBody::value_list + lVar13));
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x18);
  memory_allocator_deallocate(local_f0,__s1);
  pAVar9 = (AssertHelperData *)value_create_map(TestBody::value_map,2);
  size = 0;
  local_108.data_ = pAVar9;
  testing::internal::CmpHelperNE<void*,void*>
            ((internal *)local_e8,"(value)__null","(value)v",(void **)&size,&local_108.data_);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x9d,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  pcVar10 = (char *)serial_serialize(uVar5,pAVar9,&serialize_size,local_f0);
  size = 0x18;
  local_108.data_ = (AssertHelperData *)serialize_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e8,"(size_t)sizeof(value_map_str)","(size_t)serialize_size",&size,
             (unsigned_long *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xa2,pcVar14);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = 0;
  local_108.data_ = pAVar9;
  testing::internal::CmpHelperNE<void*,void*>
            ((internal *)local_e8,"(value)__null","(value)v",(void **)&size,&local_108.data_);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xa3,pcVar14);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = size & 0xffffffff00000000;
  iVar4 = strcmp(pcVar10,"{\"aaa\":3.333,\"bbb\":4.5}");
  local_108.data_._0_4_ = iVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0","(int)strcmp(buffer, value_map_str)",(int *)&size,
             (int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xa4,pcVar14);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  puVar11 = (undefined8 *)value_to_map(pAVar9);
  puVar12 = (undefined8 *)value_to_array(*puVar11);
  value_destroy(*puVar12);
  value_destroy(puVar12[1]);
  value_destroy(*puVar11);
  puVar12 = (undefined8 *)value_to_array(puVar11[1]);
  value_destroy(*puVar12);
  value_destroy(puVar12[1]);
  value_destroy(puVar11[1]);
  value_destroy(pAVar9);
  memory_allocator_deallocate(local_f0,pcVar10);
  pAVar9 = (AssertHelperData *)value_create_array(0,0);
  size = 0;
  local_108.data_ = pAVar9;
  testing::internal::CmpHelperNE<void*,void*>
            ((internal *)local_e8,"(value)__null","(value)v",(void **)&size,&local_108.data_);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xb9,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  pcVar10 = (char *)serial_serialize(uVar5,pAVar9,&serialize_size,local_f0);
  size = 3;
  local_108.data_ = (AssertHelperData *)serialize_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e8,"(size_t)sizeof(json_empty_array)","(size_t)serialize_size",&size,
             (unsigned_long *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xbe,pcVar14);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = 0;
  local_108.data_ = pAVar9;
  testing::internal::CmpHelperNE<void*,void*>
            ((internal *)local_e8,"(value)__null","(value)v",(void **)&size,&local_108.data_);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xbf,pcVar14);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = size & 0xffffffff00000000;
  iVar4 = strcmp(pcVar10,"[]");
  local_108.data_._0_4_ = iVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0","(int)strcmp(buffer, json_empty_array)",(int *)&size,
             (int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xc0,pcVar14);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  value_destroy(pAVar9);
  sVar1 = local_f0;
  memory_allocator_deallocate(local_f0,pcVar10);
  uVar6 = serial_deserialize(uVar5,"[\"asdf\",443,3.2]",0x11,sVar1);
  size = CONCAT44(size._4_4_,9);
  uVar3 = value_type_id(uVar6);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_ARRAY","(type_id)value_type_id(v)",(int *)&size,
             (int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xc9,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = 3;
  local_108.data_ = (AssertHelperData *)value_type_count(uVar6);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e8,"(size_t)json_buffer_array_size","(size_t)value_type_count(v)",
             &size,(unsigned_long *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xca,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  pAVar9 = (AssertHelperData *)value_to_array(uVar6);
  size = 0;
  local_108.data_ = pAVar9;
  testing::internal::CmpHelperNE<void**,void**>
            ((internal *)local_e8,"(value *)__null","(value *)v_array",(void ***)&size,
             (void ***)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xce,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = CONCAT44(size._4_4_,7);
  uVar3 = value_type_id(*(undefined8 *)pAVar9);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_STRING","(type_id)value_type_id(v_array[0])",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = size & 0xffffffff00000000;
  pcVar10 = (char *)value_to_string(*(undefined8 *)pAVar9);
  iVar4 = strcmp(pcVar10,"asdf");
  local_108.data_._0_4_ = iVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0","(int)strcmp(value_to_string(v_array[0]), \"asdf\")",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd1,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = CONCAT44(size._4_4_,3);
  uVar3 = value_type_id(pAVar9->file);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_INT","(type_id)value_type_id(v_array[1])",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd3,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = CONCAT44(size._4_4_,0x1bb);
  uVar3 = value_to_int(pAVar9->file);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)443","(int)value_to_int(v_array[1])",(int *)&size,
             (int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd4,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = CONCAT44(size._4_4_,5);
  uVar3 = value_type_id(*(undefined8 *)&pAVar9->line);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_FLOAT","(type_id)value_type_id(v_array[2])",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd6,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = CONCAT44(size._4_4_,0x404ccccd);
  uVar3 = value_to_float(*(undefined8 *)&pAVar9->line);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_e8,"(float)3.2f","(float)value_to_float(v_array[2])",(float *)&size,
             (float *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd7,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  lVar13 = 0;
  do {
    value_destroy(*(undefined8 *)(&pAVar9->type + lVar13 * 2));
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  value_destroy(uVar6);
  uVar6 = serial_deserialize(uVar5,"{\"abc\":9.9,\"cde\":1.5}",0x16,local_f0);
  size = CONCAT44(size._4_4_,10);
  uVar3 = value_type_id(uVar6);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_MAP","(type_id)value_type_id(v)",(int *)&size,
             (int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xe3,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = 2;
  local_108.data_ = (AssertHelperData *)value_type_count(uVar6);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e8,"(size_t)json_buffer_map_size","(size_t)value_type_count(v)",&size
             ,(unsigned_long *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xe4,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  pAVar9 = (AssertHelperData *)value_to_map(uVar6);
  size = 0;
  local_108.data_ = pAVar9;
  testing::internal::CmpHelperNE<void**,void**>
            ((internal *)local_e8,"(value *)__null","(value *)v_map",(void ***)&size,
             (void ***)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xe8,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = CONCAT44(size._4_4_,9);
  uVar3 = value_type_id(*(undefined8 *)pAVar9);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_ARRAY","(type_id)value_type_id(v_map[0])",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xea,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = CONCAT44(size._4_4_,9);
  uVar3 = value_type_id(pAVar9->file);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_ARRAY","(type_id)value_type_id(v_map[1])",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xeb,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  puVar11 = (undefined8 *)value_to_array(*(undefined8 *)pAVar9);
  size = CONCAT44(size._4_4_,7);
  uVar3 = value_type_id(*puVar11);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_STRING","(type_id)value_type_id(tupla[0])",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xef,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar12 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar12);
  }
  size = size & 0xffffffff00000000;
  pcVar10 = (char *)value_to_string(*puVar11);
  iVar4 = strcmp(pcVar10,"abc");
  local_108.data_._0_4_ = iVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0","(int)strcmp(value_to_string(tupla[0]), \"abc\")",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xf0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar12 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar12);
  }
  size = CONCAT44(size._4_4_,5);
  uVar3 = value_type_id(puVar11[1]);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_FLOAT","(type_id)value_type_id(tupla[1])",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xf2,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar12 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar12);
  }
  size = CONCAT44(size._4_4_,0x411e6666);
  uVar3 = value_to_float(puVar11[1]);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_e8,"(float)9.9f","(float)value_to_float(tupla[1])",(float *)&size,
             (float *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xf3,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar12 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar12);
  }
  value_destroy(*puVar11);
  value_destroy(puVar11[1]);
  value_destroy(*(undefined8 *)pAVar9);
  puVar11 = (undefined8 *)value_to_array(pAVar9->file);
  size = CONCAT44(size._4_4_,7);
  uVar3 = value_type_id(*puVar11);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_STRING","(type_id)value_type_id(tupla[0])",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xfc,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar12 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar12);
  }
  size = size & 0xffffffff00000000;
  pcVar10 = (char *)value_to_string(*puVar11);
  iVar4 = strcmp(pcVar10,"cde");
  local_108.data_._0_4_ = iVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0","(int)strcmp(value_to_string(tupla[0]), \"cde\")",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xfd,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar12 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar12);
  }
  size = CONCAT44(size._4_4_,5);
  uVar3 = value_type_id(puVar11[1]);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_FLOAT","(type_id)value_type_id(tupla[1])",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xff,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar12 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar12);
  }
  size = CONCAT44(size._4_4_,0x3fc00000);
  uVar3 = value_to_float(puVar11[1]);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_e8,"(float)1.5f","(float)value_to_float(tupla[1])",(float *)&size,
             (float *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x100,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar12 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar12);
  }
  value_destroy(*puVar11);
  value_destroy(puVar11[1]);
  value_destroy(pAVar9->file);
  value_destroy(uVar6);
  uVar6 = serial_deserialize(uVar5,"true",5,local_f0);
  size = size & 0xffffffff00000000;
  uVar3 = value_type_id(uVar6);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_BOOL","(type_id)value_type_id(v)",(int *)&size,
             (int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x10c,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = 1;
  local_108.data_ = (AssertHelperData *)value_type_size(uVar6);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e8,"(size_t)sizeof(unsigned char)","(size_t)value_type_size(v)",&size
             ,(unsigned_long *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x10d,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = CONCAT71(size._1_7_,1);
  uVar2 = value_to_bool(uVar6);
  local_108.data_._0_1_ = uVar2;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)local_e8,"(unsigned char)1L","(unsigned char)value_to_bool(v)",
             (uchar *)&size,(uchar *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x10e,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  value_destroy(uVar6);
  uVar6 = serial_deserialize(uVar5,"23434",6,local_f0);
  size = CONCAT44(size._4_4_,3);
  uVar3 = value_type_id(uVar6);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_INT","(type_id)value_type_id(v)",(int *)&size,
             (int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x115,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = 4;
  local_108.data_ = (AssertHelperData *)value_type_size(uVar6);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e8,"(size_t)sizeof(int)","(size_t)value_type_size(v)",&size,
             (unsigned_long *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x116,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = CONCAT44(size._4_4_,0x5b8a);
  uVar3 = value_to_int(uVar6);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)23434","(int)value_to_int(v)",(int *)&size,(int *)&local_108
            );
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x117,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  value_destroy(uVar6);
  uVar5 = serial_deserialize(uVar5,"\"Hello World\"",0xe,local_f0);
  size = CONCAT44(size._4_4_,7);
  uVar3 = value_type_id(uVar5);
  local_108.data_._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(type_id)TYPE_STRING","(type_id)value_type_id(v)",(int *)&size,
             (int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x11e,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = 0xc;
  local_108.data_ = (AssertHelperData *)value_type_size(uVar5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e8,"(size_t)sizeof(json_string_value)","(size_t)value_type_size(v)",
             &size,(unsigned_long *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x11f,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  size = size & 0xffffffff00000000;
  pcVar10 = (char *)value_to_string(uVar5);
  iVar4 = strncmp(pcVar10,"Hello World",0xb);
  local_108.data_._0_4_ = iVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0",
             "(int)strncmp(value_to_string(v), json_string_value, sizeof(json_string_value) - 1)",
             (int *)&size,(int *)&local_108);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x120,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&size);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (size != 0) {
      (**(code **)(*(long *)size + 8))();
    }
  }
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(local_e8[1]);
  }
  value_destroy(uVar5);
  if (TestBody()::value_list == '\0') {
    iVar4 = __cxa_guard_acquire(&TestBody()::value_list);
    if (iVar4 != 0) {
      TestBody()::value_list[0] = (value)value_create_int(0xf4);
      TestBody()::value_list[1] = (value)value_create_double(0x33333333);
      TestBody()::value_list[2] = (value)value_create_string("hello world",0xb);
      __cxa_guard_release(&TestBody()::value_list);
    }
  }
  local_e8[0] = (undefined8 *)value_create_bool(1);
  local_e8[1] = (undefined8 *)value_create_char(0x41);
  local_e8[2] = (undefined8 *)value_create_short(0x7b);
  local_e8[3] = (undefined8 *)value_create_int(0xdc90);
  local_e8[4] = (undefined8 *)value_create_long(0xef9ca33);
  local_e8[5] = (undefined8 *)value_create_float(0x4158b852);
  local_e8[6] = (undefined8 *)value_create_double(0x2ca57a78);
  local_e8[7] = (undefined8 *)value_create_string("hello world",0xb);
  local_e8[8] = (undefined8 *)value_create_buffer("\x05\x06\a\b",4);
  local_e8[9] = (undefined8 *)value_create_array(TestBody()::value_list,3);
  local_e8[10] = (undefined8 *)0x0;
  local_e8[0xb] = (undefined8 *)value_create_ptr(0xa7ef2);
  local_e8[0xc] = (undefined8 *)0x0;
  local_e8[0xd] = (undefined8 *)0x0;
  local_e8[0xe] = (undefined8 *)value_create_null();
  local_e8[0xf] = (undefined8 *)0x0;
  local_e8[0x10] = (undefined8 *)0x0;
  local_e8[0x11] = (undefined8 *)0x0;
  local_e8[0x12] = (undefined8 *)0x0;
  local_40 = serial_create("metacall");
  ppcVar15 = TestBody::value_names;
  uVar16 = 0;
  do {
    if ((0x7b400UL >> (uVar16 & 0x3f) & 1) == 0) {
      puVar11 = local_e8[uVar16];
      local_48 = (char *)serial_serialize(local_40,puVar11,&size,local_f0);
      pcVar10 = *ppcVar15;
      log_write_impl_va("metacall",0x1ab,"TestBody",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
                        ,0,"(%s == %s)",local_48,pcVar10);
      local_108.data_ = (AssertHelperData *)size;
      local_50.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                ((internal *)&serialize_size,"(size_t)size","(size_t)0",(unsigned_long *)&local_108,
                 (unsigned_long *)&local_50);
      if ((char)serialize_size == '\0') {
        testing::Message::Message((Message *)&local_108);
        pcVar14 = "";
        if (local_f8 != (undefined8 *)0x0) {
          pcVar14 = (char *)*local_f8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
                   ,0x1ad,pcVar14);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_108.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_108.data_ + 8))();
        }
      }
      puVar12 = local_f8;
      local_38 = puVar11;
      if (local_f8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_f8 != local_f8 + 2) {
          operator_delete((undefined8 *)*local_f8);
        }
        operator_delete(puVar12);
      }
      local_108.data_ = local_108.data_ & 0xffffffff00000000;
      iVar4 = strncmp(local_48,pcVar10,size - 1);
      local_50.data_._0_4_ = iVar4;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&serialize_size,"(int)0",
                 "(int)strncmp(buffer, value_names[iterator], size - 1)",(int *)&local_108,
                 (int *)&local_50);
      if ((char)serialize_size == '\0') {
        testing::Message::Message((Message *)&local_108);
        pcVar10 = "";
        if (local_f8 != (undefined8 *)0x0) {
          pcVar10 = (char *)*local_f8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
                   ,0x1af,pcVar10);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_108.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_108.data_ + 8))();
        }
      }
      puVar11 = local_f8;
      if (local_f8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_f8 != local_f8 + 2) {
          operator_delete((undefined8 *)*local_f8);
        }
        operator_delete(puVar11);
      }
      memory_allocator_deallocate(local_f0,local_48);
      value_type_destroy(local_38);
    }
    uVar16 = uVar16 + 1;
    ppcVar15 = ppcVar15 + 1;
  } while (uVar16 != 0x13);
  serialize_size = serialize_size & 0xffffffff00000000;
  uVar5 = serial_create("rapid_json");
  uVar3 = serial_clear(uVar5);
  size = CONCAT44(size._4_4_,uVar3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0","(int)serial_clear(serial_create(rapid_json_name()))",
             (int *)&serialize_size,(int *)&size);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&serialize_size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x1b9,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&size,(Message *)&serialize_size);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&size);
    if (serialize_size != 0) {
      (**(code **)(*(long *)serialize_size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  serialize_size = serialize_size & 0xffffffff00000000;
  uVar5 = serial_create("metacall");
  uVar3 = serial_clear(uVar5);
  size = CONCAT44(size._4_4_,uVar3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"(int)0","(int)serial_clear(serial_create(metacall_name()))",
             (int *)&serialize_size,(int *)&size);
  if (local_e8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&serialize_size);
    if (local_e8[1] == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (char *)*local_e8[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x1bc,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&size,(Message *)&serialize_size);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&size);
    if (serialize_size != 0) {
      (**(code **)(*(long *)serialize_size + 8))();
    }
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e8[1] != local_e8[1] + 2) {
      operator_delete((undefined8 *)*local_e8[1]);
    }
    operator_delete(puVar11);
  }
  serial_destroy();
  memory_allocator_destroy(local_f0);
  return;
}

Assistant:

TEST_F(serial_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	// Create allocator
	memory_allocator allocator = memory_allocator_std(&malloc, &realloc, &free);

	EXPECT_NE((memory_allocator)NULL, (memory_allocator)allocator);

	// Initialize serial
	EXPECT_EQ((int)0, (int)serial_initialize());

	// Create RapidJSON serial
	create_serial(rapid_json_name(), rapid_json_extension());

	// Create MetaCall serial
	create_serial(metacall_name(), metacall_extension());

	// RapidJSON
	{
		static const char hello_world[] = "hello world";

		static const value value_list[] = {
			value_create_int(244),
			value_create_double(6.8),
			value_create_string(hello_world, sizeof(hello_world) - 1)
		};

		static const char map_index_a[] = "aaa";
		static const char map_index_b[] = "bbb";

		static const value value_map_a[] = {
			value_create_string(map_index_a, sizeof(map_index_a) - 1),
			value_create_double(3.333)
		};

		static const value value_map_b[] = {
			value_create_string(map_index_b, sizeof(map_index_b) - 1),
			value_create_double(4.5)
		};

		static const value value_map[] = {
			value_create_array(value_map_a, sizeof(value_map_a) / sizeof(value_map_a[0])),
			value_create_array(value_map_b, sizeof(value_map_b) / sizeof(value_map_b[0]))
		};

		static const size_t value_list_size = sizeof(value_list) / sizeof(value_list[0]);
		static const char value_list_str[] = "[244,6.8,\"hello world\"]";
		static const size_t value_map_size = sizeof(value_map) / sizeof(value_map[0]);
		static const char value_map_str[] = "{\"aaa\":3.333,\"bbb\":4.5}";

		static const char json_buffer_array[] = "[\"asdf\",443,3.2]";
		static const size_t json_buffer_array_size = 3;

		static const char json_buffer_map[] = "{\"abc\":9.9,\"cde\":1.5}";
		static const size_t json_buffer_map_size = 2;

		static const char json_true[] = "true";
		static const char json_number[] = "23434";
		static const char json_string[] = "\"Hello World\"";
		static const char json_string_value[] = "Hello World";

		static const char json_empty_array[] = "[]";

		size_t serialize_size = 0;

		serial s = serial_create(rapid_json_name());

		// Create value array from value list
		value v = value_create_array(value_list, value_list_size);

		EXPECT_NE((value)NULL, (value)v);

		// Serialize value array into buffer
		char *buffer = serial_serialize(s, v, &serialize_size, allocator);

		EXPECT_EQ((size_t)sizeof(value_list_str), (size_t)serialize_size);
		EXPECT_NE((char *)NULL, (char *)buffer);
		EXPECT_EQ((int)0, (int)strcmp(buffer, value_list_str));

		value_destroy(v);

		for (size_t iterator = 0; iterator < value_list_size; ++iterator)
		{
			value_destroy(value_list[iterator]);
		}

		memory_allocator_deallocate(allocator, buffer);

		// Create value map from value list map
		v = value_create_map(value_map, value_map_size);

		EXPECT_NE((value)NULL, (value)v);

		// Serialize value map into buffer
		buffer = serial_serialize(s, v, &serialize_size, allocator);

		EXPECT_EQ((size_t)sizeof(value_map_str), (size_t)serialize_size);
		EXPECT_NE((value)NULL, (value)v);
		EXPECT_EQ((int)0, (int)strcmp(buffer, value_map_str));

		value *v_map = value_to_map(v);

		for (size_t iterator = 0; iterator < value_map_size; ++iterator)
		{
			value *tupla = value_to_array(v_map[iterator]);

			value_destroy(tupla[0]);
			value_destroy(tupla[1]);

			value_destroy(v_map[iterator]);
		}

		value_destroy(v);

		memory_allocator_deallocate(allocator, buffer);

		// Create an empty array
		v = value_create_array(NULL, 0);

		EXPECT_NE((value)NULL, (value)v);

		// Serialize empty array into buffer
		buffer = serial_serialize(s, v, &serialize_size, allocator);

		EXPECT_EQ((size_t)sizeof(json_empty_array), (size_t)serialize_size);
		EXPECT_NE((value)NULL, (value)v);
		EXPECT_EQ((int)0, (int)strcmp(buffer, json_empty_array));

		value_destroy(v);

		memory_allocator_deallocate(allocator, buffer);

		// Deserialize json buffer array into value
		v = serial_deserialize(s, json_buffer_array, sizeof(json_buffer_array), allocator);

		EXPECT_EQ((type_id)TYPE_ARRAY, (type_id)value_type_id(v));
		EXPECT_EQ((size_t)json_buffer_array_size, (size_t)value_type_count(v));

		value *v_array = value_to_array(v);

		EXPECT_NE((value *)NULL, (value *)v_array);

		EXPECT_EQ((type_id)TYPE_STRING, (type_id)value_type_id(v_array[0]));
		EXPECT_EQ((int)0, (int)strcmp(value_to_string(v_array[0]), "asdf"));

		EXPECT_EQ((type_id)TYPE_INT, (type_id)value_type_id(v_array[1]));
		EXPECT_EQ((int)443, (int)value_to_int(v_array[1]));

		EXPECT_EQ((type_id)TYPE_FLOAT, (type_id)value_type_id(v_array[2]));
		EXPECT_EQ((float)3.2f, (float)value_to_float(v_array[2]));

		for (size_t iterator = 0; iterator < value_list_size; ++iterator)
		{
			value_destroy(v_array[iterator]);
		}

		value_destroy(v);

		// Deserialize json buffer map into value
		v = serial_deserialize(s, json_buffer_map, sizeof(json_buffer_map), allocator);

		EXPECT_EQ((type_id)TYPE_MAP, (type_id)value_type_id(v));
		EXPECT_EQ((size_t)json_buffer_map_size, (size_t)value_type_count(v));

		v_map = value_to_map(v);

		EXPECT_NE((value *)NULL, (value *)v_map);

		EXPECT_EQ((type_id)TYPE_ARRAY, (type_id)value_type_id(v_map[0]));
		EXPECT_EQ((type_id)TYPE_ARRAY, (type_id)value_type_id(v_map[1]));

		value *tupla = value_to_array(v_map[0]);

		EXPECT_EQ((type_id)TYPE_STRING, (type_id)value_type_id(tupla[0]));
		EXPECT_EQ((int)0, (int)strcmp(value_to_string(tupla[0]), "abc"));

		EXPECT_EQ((type_id)TYPE_FLOAT, (type_id)value_type_id(tupla[1]));
		EXPECT_EQ((float)9.9f, (float)value_to_float(tupla[1]));

		value_destroy(tupla[0]);
		value_destroy(tupla[1]);

		value_destroy(v_map[0]);

		tupla = value_to_array(v_map[1]);

		EXPECT_EQ((type_id)TYPE_STRING, (type_id)value_type_id(tupla[0]));
		EXPECT_EQ((int)0, (int)strcmp(value_to_string(tupla[0]), "cde"));

		EXPECT_EQ((type_id)TYPE_FLOAT, (type_id)value_type_id(tupla[1]));
		EXPECT_EQ((float)1.5f, (float)value_to_float(tupla[1]));

		value_destroy(tupla[0]);
		value_destroy(tupla[1]);

		value_destroy(v_map[1]);

		value_destroy(v);

		// Deserialize json boolean primitive type into value
		v = serial_deserialize(s, json_true, sizeof(json_true), allocator);

		EXPECT_EQ((type_id)TYPE_BOOL, (type_id)value_type_id(v));
		EXPECT_EQ((size_t)sizeof(boolean), (size_t)value_type_size(v));
		EXPECT_EQ((boolean)1L, (boolean)value_to_bool(v));

		value_destroy(v);

		// Deserialize json number primitive type into value
		v = serial_deserialize(s, json_number, sizeof(json_number), allocator);

		EXPECT_EQ((type_id)TYPE_INT, (type_id)value_type_id(v));
		EXPECT_EQ((size_t)sizeof(int), (size_t)value_type_size(v));
		EXPECT_EQ((int)23434, (int)value_to_int(v));

		value_destroy(v);

		// Deserialize json string primitive type into value
		v = serial_deserialize(s, json_string, sizeof(json_string), allocator);

		EXPECT_EQ((type_id)TYPE_STRING, (type_id)value_type_id(v));
		EXPECT_EQ((size_t)sizeof(json_string_value), (size_t)value_type_size(v));
		EXPECT_EQ((int)0, (int)strncmp(value_to_string(v), json_string_value, sizeof(json_string_value) - 1));

		value_destroy(v);
	}

	// MetaCall
	{
		static const char hello_world[] = "hello world";
		static const size_t hello_world_length = sizeof(hello_world) - 1;

		static const char *value_names[] = {
			"true",
			"A",
			"123",
			"56464",
			"251251251",
			"13.545000f",
			"545.345300",
			hello_world,
			"05060708",
			"[244,6.800000,hello world]",
			NULL, /* TODO: Map */
#if defined(_WIN32) && defined(_MSC_VER)
	#if defined(_WIN64)
			"0x00000000000A7EF2",
	#else
			"0x000A7EF2",
	#endif
#elif defined(__linux) || defined(__linux__) || defined(__APPLE__)
			"0xa7ef2",
#else
			"<unknown>",
#endif
			NULL, /* TODO: Future */
			NULL, /* TODO: Function */
			"(null)",
			NULL, /* TODO: Class */
			NULL, /* TODO: Object */
			NULL, /* TODO: Exception */
			NULL  /* TODO: Throwable */
		};

		portability_static_assert((int)sizeof(value_names) / sizeof(value_names[0]) == (int)TYPE_SIZE,
			"Value names size does not match type size.");

		static const char char_array[] = {
			0x05, 0x06, 0x07, 0x08
		};

		static const value value_list[] = {
			value_create_int(244),
			value_create_double(6.8),
			value_create_string(hello_world, hello_world_length)
		};

		static const size_t value_list_size = sizeof(value_list) / sizeof(value_list[0]);

		/* TODO: Implement map properly */
		/*
		static const char good_bye[] = "good bye";
		static const size_t good_bye_length = sizeof(good_bye) - 1;

		static const value value_map_tupla_a[] =
		{
			value_create_string(hello_world, hello_world_length),
			value_create_int(9874),
		};

		static const value value_map_tupla_b[] =
		{
			value_create_string(good_bye, good_bye_length),
			value_create_int(1111),
		};

		static const value value_map[] =
		{
			value_create_array(value_map_tupla_a, sizeof(value_map_tupla_a) / sizeof(value_map_tupla_a[0])),
			value_create_array(value_map_tupla_b, sizeof(value_map_tupla_b) / sizeof(value_map_tupla_b[0]))
		};

		static const size_t value_map_size = sizeof(value_map) / sizeof(value_map[0]);
		*/

		/* TODO: Implement class properly */
		/* klass cls = class_create(NULL, ACCESSOR_TYPE_STATIC, NULL, NULL); */

		value value_array[] = {
			value_create_bool(1),
			value_create_char('A'),
			value_create_short(123),
			value_create_int(56464),
			value_create_long(251251251L),
			value_create_float(13.545f),
			value_create_double(545.3453),
			value_create_string(hello_world, hello_world_length),
			value_create_buffer(char_array, sizeof(char_array)),
			value_create_array(value_list, value_list_size),
			/* TODO: Implement map properly */
			NULL,
			/*
			value_create_map(value_map, value_map_size),
			*/
			value_create_ptr((void *)0x000A7EF2),
			/* TODO: Implement class properly */
			NULL,
			NULL,
			/*
			value_create_future(future_create(NULL, NULL)),
			value_create_function(function_create(NULL, 0, NULL, NULL)),
			*/
			value_create_null(),
			/* TODO: Implement class properly */
			NULL,
			NULL,
			/*
			value_create_class(cls),
			value_create_object(class_new(cls, NULL, NULL, 0)),
			*/
			/* TODO: Implement exception properly */
			NULL,
			NULL
		};

		portability_static_assert((int)sizeof(value_array) / sizeof(value_array[0]) == (int)TYPE_SIZE,
			"Value array size does not match type size.");

		const size_t value_names_size = sizeof(value_names) / sizeof(value_names[0]);

		serial s = serial_create(metacall_name());

		for (size_t iterator = 0; iterator < value_names_size; ++iterator)
		{
			/* TODO: Remove this workaround when type map and future/function stringification is implemented */
			if (value_names[iterator] != NULL)
			{
				size_t size;

				char *buffer = serial_serialize(s, value_array[iterator], &size, allocator);

				log_write("metacall", LOG_LEVEL_DEBUG, "(%s == %s)", buffer, value_names[iterator]);

				EXPECT_GT((size_t)size, (size_t)0);

				EXPECT_EQ((int)0, (int)strncmp(buffer, value_names[iterator], size - 1));

				memory_allocator_deallocate(allocator, buffer);

				value_type_destroy(value_array[iterator]);
			}
		}
	}

	// Clear RapidJSON serial
	EXPECT_EQ((int)0, (int)serial_clear(serial_create(rapid_json_name())));

	// Clear MetaCall serial
	EXPECT_EQ((int)0, (int)serial_clear(serial_create(metacall_name())));

	// Destroy serial
	serial_destroy();

	// Destroy allocator
	memory_allocator_destroy(allocator);
}